

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O0

bool wasm::isSignedOp(BinaryOp op)

{
  bool local_9;
  BinaryOp op_local;
  
  if (((((op == LtSInt32) || (op == LeSInt32)) || (op == GtSInt32)) ||
      ((op == GeSInt32 || (op == LtSInt64)))) ||
     ((op == LeSInt64 || ((op == GtSInt64 || (op == GeSInt64)))))) {
    local_9 = true;
  }
  else {
    local_9 = false;
  }
  return local_9;
}

Assistant:

static bool isSignedOp(BinaryOp op) {
  switch (op) {
    case LtSInt32:
    case LeSInt32:
    case GtSInt32:
    case GeSInt32:
    case LtSInt64:
    case LeSInt64:
    case GtSInt64:
    case GeSInt64:
      return true;
    default:
      return false;
  }
}